

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  size_t n;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  size_t n_1;
  uint8_t to;
  uint8_t from;
  uint8_t num [64];
  char raw [65];
  uint8_t res [64];
  
  from = '\0';
  to = '\0';
  raw[0] = '\n';
  while (raw[0] == '\n') {
    printf("Please enter a number: ");
    pcVar3 = fgets(raw,0x41,_stdin);
    if (pcVar3 == (char *)0x0) goto LAB_00101330;
  }
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
    num[lVar4] = '\0';
  }
  for (lVar4 = 0; ((lVar4 != 0x40 && (cVar1 = raw[lVar4], cVar1 != '\0')) && (cVar1 != '\n'));
      lVar4 = lVar4 + 1) {
    if ((byte)(cVar1 - 0x3aU) < 0xf6) {
      printf("Invalid number!");
      return 1;
    }
    num[lVar4] = cVar1 + 0xd0;
  }
  printf("What base is the number you just entered (2-10)? ");
  while (iVar2 = __isoc99_scanf("%hhu",&from), iVar2 != -1) {
    if (((iVar2 != 0) && (0xf6 < (byte)(from - 0xb))) ||
       (puts("This isn\'t a valid number!"), iVar2 != 0)) {
      printf("What base do you want to convert it to (2-10)? ");
      goto LAB_001012a8;
    }
    __isoc99_scanf("%*[^\n]");
  }
LAB_00101330:
  putchar(10);
  return 0;
LAB_001012a8:
  iVar2 = __isoc99_scanf("%hhu",&to);
  if (iVar2 == -1) goto LAB_00101330;
  if (((iVar2 != 0) && (0xf6 < (byte)(to - 0xb))) ||
     (puts("This isn\'t a valid number!"), iVar2 != 0)) {
    sVar5 = change_base(num,from,to,res);
    if (sVar5 == 0xffffffffffffffff) {
      puts("Couldn\'t change base: this is likely due to an overflow.");
      return 0;
    }
    printf("Your modified number is: ");
    for (; sVar5 != 0xffffffffffffffff; sVar5 = sVar5 - 1) {
      putchar(res[sVar5] + 0x30);
    }
    goto LAB_00101330;
  }
  __isoc99_scanf("%*[^\n]");
  goto LAB_001012a8;
}

Assistant:

int main(int argc, char** argv) {
  uint8_t res[64], num[64];
  uint8_t from = 0, to = 0;

  char raw[65];
  raw[0] = '\n';

  while (raw[0] == '\n') {
    printf("Please enter a number: ");
    if (fgets(raw, sizeof raw, stdin) == NULL) {
      printf("\n");
      return 0;
    }
  }

  for (size_t n = 0; n < 64; n++) num[n] = 0;

  for (size_t n = 0; n < 64; n++) {
    if (raw[n] == '\n' || raw[n] == 0) break;
    if (raw[n] < '0' || raw[n] > '9') {
      printf("Invalid number!");
      return 1;
    }
    num[n] = (uint8_t)(raw[n] - '0');
  }

  printf("What base is the number you just entered (2-10)? ");
  int scanf_res = 0;
  while (scanf_res == 0) {
    scanf_res = scanf("%" SCNu8, &from);
    if (scanf_res == EOF) {
      printf("\n");
      return 0;
    } else if (scanf_res == 0 || from <= 1 || from > 10) {
      printf("This isn't a valid number!\n");
      if (scanf_res == 0) scanf("%*[^\n]");
    }
  }

  printf("What base do you want to convert it to (2-10)? ");
  scanf_res = 0;
  while (scanf_res == 0) {
    scanf_res = scanf("%" SCNu8, &to);
    if (scanf_res == EOF) {
      printf("\n");
      return 0;
    } else if (scanf_res == 0 || to <= 1 || to > 10) {
      printf("This isn't a valid number!\n");
      if (scanf_res == 0) scanf("%*[^\n]");
    }
  }

  size_t max_index = change_base(num, from, to, res);

  if (max_index != (size_t)(-1)) {
    printf("Your modified number is: ");
    for (size_t n = max_index; n != (size_t)(-1); n--) {
      printf("%c", res[n] + '0');
    }
    printf("\n");
  } else {
    printf("Couldn't change base: this is likely due to an overflow.\n");
  }

  return 0;
}